

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::shiftPvec(SPxSolverBase<double> *this)

{
  bool bVar1;
  double *pdVar2;
  byte bVar3;
  double dVar4;
  double dVar5;
  int i;
  bool tmp;
  double allow;
  double maxrandom;
  double minrandom;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  VectorBase<double> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  Random *in_stack_ffffffffffffff10;
  SPxSolverBase<double> *in_stack_ffffffffffffff18;
  SPxSolverBase<double> *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  SPxSolverBase<double> *in_stack_ffffffffffffff30;
  int local_28;
  
  leavetol((SPxSolverBase<double> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  leavetol((SPxSolverBase<double> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  dVar4 = leavetol((SPxSolverBase<double> *)
                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  dVar5 = epsilon((SPxSolverBase<double> *)0x280a64);
  dVar4 = dVar4 - dVar5;
  local_28 = dim((SPxSolverBase<double> *)0x280a8a);
  while (local_28 = local_28 + -1, -1 < local_28) {
    coId(in_stack_ffffffffffffff18,(int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
    bVar1 = isBasic(in_stack_ffffffffffffff20,(SPxId *)in_stack_ffffffffffffff18);
    bVar3 = (bVar1 ^ 0xffU) & 1;
    pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    dVar5 = *pdVar2;
    pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    if ((*pdVar2 < dVar5 + dVar4) || (bVar3 == 0)) {
      pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      dVar5 = *pdVar2;
      pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      if ((*pdVar2 <= dVar5 - dVar4) && (bVar3 != 0)) {
        pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc)
        ;
        dVar5 = *pdVar2;
        pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc)
        ;
        if ((dVar5 != *pdVar2) || (NAN(dVar5) || NAN(*pdVar2))) {
          VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          Random::next(in_stack_ffffffffffffff10,
                       (Real)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       (Real)in_stack_ffffffffffffff00);
          shiftLCbound(in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                       (double)in_stack_ffffffffffffff10);
        }
        else {
          VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          shiftLCbound(in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                       (double)in_stack_ffffffffffffff10);
          pdVar2 = VectorBase<double>::operator[]
                             (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          dVar5 = *pdVar2;
          pdVar2 = VectorBase<double>::operator[]
                             (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          *pdVar2 = dVar5;
        }
      }
    }
    else {
      pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      dVar5 = *pdVar2;
      pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      if ((dVar5 != *pdVar2) || (NAN(dVar5) || NAN(*pdVar2))) {
        VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        Random::next(in_stack_ffffffffffffff10,
                     (Real)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (Real)in_stack_ffffffffffffff00);
        shiftUCbound(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                     (double)in_stack_ffffffffffffff20);
      }
      else {
        VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        shiftUCbound(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                     (double)in_stack_ffffffffffffff20);
        pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc)
        ;
        dVar5 = *pdVar2;
        pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc)
        ;
        *pdVar2 = dVar5;
      }
    }
  }
  local_28 = coDim((SPxSolverBase<double> *)0x280ec3);
  while (local_28 = local_28 + -1, -1 < local_28) {
    id(in_stack_ffffffffffffff18,(int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
    bVar1 = isBasic(in_stack_ffffffffffffff20,(SPxId *)in_stack_ffffffffffffff18);
    bVar3 = (bVar1 ^ 0xffU) & 1;
    pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    dVar5 = *pdVar2;
    pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    if ((*pdVar2 < dVar5 + dVar4) || (bVar3 == 0)) {
      pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      in_stack_ffffffffffffff20 = (SPxSolverBase<double> *)(*pdVar2 - dVar4);
      pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      if ((*pdVar2 <= (double)in_stack_ffffffffffffff20) && (bVar3 != 0)) {
        pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc)
        ;
        in_stack_ffffffffffffff18 = (SPxSolverBase<double> *)*pdVar2;
        pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc)
        ;
        if (((double)in_stack_ffffffffffffff18 != *pdVar2) ||
           (NAN((double)in_stack_ffffffffffffff18) || NAN(*pdVar2))) {
          in_stack_ffffffffffffff0c = local_28;
          pdVar2 = VectorBase<double>::operator[]
                             (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          in_stack_ffffffffffffff10 = (Random *)*pdVar2;
          Random::next(in_stack_ffffffffffffff10,
                       (Real)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       (Real)in_stack_ffffffffffffff00);
          shiftLPbound(in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                       (double)in_stack_ffffffffffffff10);
        }
        else {
          in_stack_fffffffffffffefc = local_28;
          VectorBase<double>::operator[](in_stack_ffffffffffffff00,local_28);
          shiftLPbound(in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                       (double)in_stack_ffffffffffffff10);
          pdVar2 = VectorBase<double>::operator[]
                             (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          in_stack_ffffffffffffff00 = (VectorBase<double> *)*pdVar2;
          pdVar2 = VectorBase<double>::operator[]
                             (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          *pdVar2 = (double)in_stack_ffffffffffffff00;
        }
      }
    }
    else {
      pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      dVar5 = *pdVar2;
      pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      if ((dVar5 != *pdVar2) || (NAN(dVar5) || NAN(*pdVar2))) {
        VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        Random::next(in_stack_ffffffffffffff10,
                     (Real)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (Real)in_stack_ffffffffffffff00);
        shiftUPbound(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                     (double)in_stack_ffffffffffffff20);
      }
      else {
        in_stack_ffffffffffffff2c = local_28;
        VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        shiftUPbound(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                     (double)in_stack_ffffffffffffff20);
        pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc)
        ;
        in_stack_ffffffffffffff30 = (SPxSolverBase<double> *)*pdVar2;
        pdVar2 = VectorBase<double>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc)
        ;
        *pdVar2 = (double)in_stack_ffffffffffffff30;
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::shiftPvec()
{

   /* the allowed tolerance is (rep() == ROW) ? tolerances()->floatingPointFeastol() : tolerances()->floatingPointOpttol() because thePvec is the primal VectorBase<R> in ROW and the
    * dual VectorBase<R> in COLUMN representation; this is equivalent to leavetol()
    */
   R minrandom = 10.0 * leavetol();
   R maxrandom = 100.0 * leavetol();
   R allow = leavetol() - epsilon();
   bool tmp;
   int i;

   assert(type() == LEAVE);
   assert(allow > 0.0);

   for(i = dim() - 1; i >= 0; --i)
   {
      tmp = !isBasic(coId(i));

      if((*theCoUbound)[i] + allow <= (*theCoPvec)[i] && tmp)
      {
         if((*theCoUbound)[i] != (*theCoLbound)[i])
            shiftUCbound(i, (*theCoPvec)[i] + random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftUCbound(i, (*theCoPvec)[i]);
            (*theCoLbound)[i] = (*theCoUbound)[i];
         }
      }
      else if((*theCoLbound)[i] - allow >= (*theCoPvec)[i] && tmp)
      {
         if((*theCoUbound)[i] != (*theCoLbound)[i])
            shiftLCbound(i, (*theCoPvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLCbound(i, (*theCoPvec)[i]);
            (*theCoUbound)[i] = (*theCoLbound)[i];
         }
      }
   }

   for(i = coDim() - 1; i >= 0; --i)
   {
      tmp = !isBasic(id(i));

      if((*theUbound)[i] + allow <= (*thePvec)[i] && tmp)
      {
         if((*theUbound)[i] != (*theLbound)[i])
            shiftUPbound(i, (*thePvec)[i] + random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftUPbound(i, (*thePvec)[i]);
            (*theLbound)[i] = (*theUbound)[i];
         }
      }
      else if((*theLbound)[i] - allow >= (*thePvec)[i] && tmp)
      {
         if((*theUbound)[i] != (*theLbound)[i])
            shiftLPbound(i, (*thePvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLPbound(i, (*thePvec)[i]);
            (*theUbound)[i] = (*theLbound)[i];
         }
      }
   }

#ifndef NDEBUG
   testBounds();
   SPxOut::debug(this, "DSHIFT02 shiftPvec: OK\n");
#endif
}